

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unicodeIsAlnum(unicode_tokenizer *p,int iCode)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  uVar1 = sqlite3FtsUnicodeIsalnum(iCode);
  if (p->nException < 1) {
    uVar2 = 0;
  }
  else {
    iVar3 = p->nException + -1;
    uVar2 = 0;
    iVar5 = 0;
    while (iVar5 <= iVar3) {
      uVar4 = (uint)(iVar3 + iVar5) >> 1;
      if (p->aiException[uVar4] == iCode) {
        uVar2 = 1;
        break;
      }
      if (p->aiException[uVar4] < iCode) {
        iVar5 = uVar4 + 1;
      }
      else {
        iVar3 = uVar4 - 1;
      }
    }
  }
  return uVar2 ^ uVar1;
}

Assistant:

static int unicodeIsAlnum(unicode_tokenizer *p, int iCode){
  assert( (sqlite3FtsUnicodeIsalnum(iCode) & 0xFFFFFFFE)==0 );
  return sqlite3FtsUnicodeIsalnum(iCode) ^ unicodeIsException(p, iCode);
}